

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

PackageSymbol *
slang::ast::findPackage
          (string_view packageName,Scope *lookupScope,SourceLocation errorLoc,bool isFromExport)

{
  string_view arg;
  string_view lookupName;
  bool bVar1;
  Compilation *this;
  PackageSymbol *pPVar2;
  PackageSymbol *this_00;
  Diagnostic *in_RCX;
  Scope *in_RDX;
  char *in_RSI;
  char *in_RDI;
  byte in_R8B;
  Scope *unaff_retaddr;
  SourceLocation in_stack_00000008;
  DiagCode in_stack_00000014;
  Symbol *sym;
  Scope *currScope;
  PackageSymbol *package;
  Compilation *comp;
  undefined8 in_stack_ffffffffffffff60;
  bitmask<slang::ast::CompilationFlags> flags;
  Scope *local_78;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar3;
  bitmask<slang::ast::CompilationFlags> in_stack_ffffffffffffffac;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  flags.m_bits = (underlying_type)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  local_18._M_len = (size_t)in_RDI;
  local_18._M_str = in_RSI;
  this = Scope::getCompilation(in_RDX);
  lookupName._M_str = local_18._M_str;
  lookupName._M_len = local_18._M_len;
  pPVar2 = Compilation::getPackage
                     ((Compilation *)
                      CONCAT44(in_stack_ffffffffffffffac.m_bits,in_stack_ffffffffffffffa8),
                      lookupName);
  local_78 = in_RDX;
  if (pPVar2 == (PackageSymbol *)0x0) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
    if (!bVar1) {
      bitmask<slang::ast::CompilationFlags>::bitmask
                ((bitmask<slang::ast::CompilationFlags> *)&stack0xffffffffffffffac,LintMode);
      bVar1 = Compilation::hasFlag(this,flags);
      if (!bVar1) {
        uVar3 = 0xd00006;
        Scope::addDiag(unaff_retaddr,in_stack_00000014,in_stack_00000008);
        arg._M_len._4_4_ = in_stack_ffffffffffffffac.m_bits;
        arg._M_len._0_4_ = uVar3;
        arg._M_str = (char *)local_18._M_len;
        Diagnostic::operator<<(in_RCX,arg);
      }
    }
  }
  else {
    do {
      this_00 = (PackageSymbol *)Scope::asSymbol(local_78);
      if (pPVar2 == this_00) {
        if ((in_R8B & 1) == 0) {
          Scope::addDiag(unaff_retaddr,in_stack_00000014,in_stack_00000008);
        }
        else {
          Scope::addDiag(unaff_retaddr,in_stack_00000014,in_stack_00000008);
        }
        return (PackageSymbol *)0x0;
      }
      local_78 = Symbol::getParentScope((Symbol *)this_00);
    } while (local_78 != (Scope *)0x0);
  }
  return pPVar2;
}

Assistant:

static const PackageSymbol* findPackage(std::string_view packageName, const Scope& lookupScope,
                                        SourceLocation errorLoc, bool isFromExport) {
    auto& comp = lookupScope.getCompilation();
    auto package = comp.getPackage(packageName);
    if (!package) {
        if (!packageName.empty() && !comp.hasFlag(CompilationFlags::LintMode))
            lookupScope.addDiag(diag::UnknownPackage, errorLoc) << packageName;
    }
    else {
        // Make sure we aren't trying to import/export our own package.
        auto currScope = &lookupScope;
        do {
            auto& sym = currScope->asSymbol();
            if (package == &sym) {
                if (isFromExport)
                    lookupScope.addDiag(diag::PackageExportSelf, errorLoc);
                else
                    lookupScope.addDiag(diag::PackageImportSelf, errorLoc);
                return nullptr;
            }

            currScope = sym.getParentScope();
        } while (currScope);
    }

    return package;
}